

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

size_t __thiscall
google::protobuf::hash<google::protobuf::MapKey>::operator()
          (hash<google::protobuf::MapKey> *this,MapKey *map_key)

{
  bool bVar1;
  CppType CVar2;
  uint32 uVar3;
  int32 iVar4;
  LogMessage *pLVar5;
  uint64 uVar6;
  string *key;
  size_t sVar7;
  LogFinisher local_41;
  LogMessage local_40;
  
  CVar2 = MapKey::type(map_key);
  switch(CVar2) {
  case CPPTYPE_INT32:
    iVar4 = MapKey::GetInt32Value(map_key);
    sVar7 = (size_t)iVar4;
    break;
  case CPPTYPE_INT64:
    sVar7 = MapKey::GetInt64Value(map_key);
    return sVar7;
  case CPPTYPE_UINT32:
    uVar3 = MapKey::GetUInt32Value(map_key);
    sVar7 = (size_t)uVar3;
    break;
  case CPPTYPE_UINT64:
    uVar6 = MapKey::GetUInt64Value(map_key);
    return uVar6;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x316);
    pLVar5 = internal::LogMessage::operator<<(&local_40,"Unsupported");
    internal::LogFinisher::operator=(&local_41,pLVar5);
    internal::LogMessage::~LogMessage(&local_40);
  default:
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x325);
    pLVar5 = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,pLVar5);
    internal::LogMessage::~LogMessage(&local_40);
    sVar7 = 0;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(map_key);
    sVar7 = (size_t)bVar1;
    break;
  case CPPTYPE_STRING:
    key = MapKey::GetStringValue_abi_cxx11_(map_key);
    sVar7 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,key);
  }
  return sVar7;
}

Assistant:

size_t operator()(const ::PROTOBUF_NAMESPACE_ID::MapKey& map_key) const {
    switch (map_key.type()) {
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_DOUBLE:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_FLOAT:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_ENUM:
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_STRING:
        return hash<std::string>()(map_key.GetStringValue());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT64:
        return hash<int64>()(map_key.GetInt64Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_INT32:
        return hash<int32>()(map_key.GetInt32Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT64:
        return hash<uint64>()(map_key.GetUInt64Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_UINT32:
        return hash<uint32>()(map_key.GetUInt32Value());
      case ::PROTOBUF_NAMESPACE_ID::FieldDescriptor::CPPTYPE_BOOL:
        return hash<bool>()(map_key.GetBoolValue());
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }